

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O1

FUNCTION_RETURN getModuleName(char *buffer)

{
  uint uVar1;
  size_t sVar2;
  ssize_t sVar3;
  FUNCTION_RETURN FVar4;
  char pidStr [64];
  char proc_path [1024];
  char path [1024];
  char acStack_868 [64];
  char local_828 [1024];
  char local_428 [1032];
  
  memset(local_428,0,0x400);
  uVar1 = getpid();
  sprintf(acStack_868,"%d",(ulong)uVar1);
  builtin_strncpy(local_828,"/proc/",7);
  strcat(local_828,acStack_868);
  sVar2 = strlen(local_828);
  builtin_strncpy(local_828 + sVar2,"/exe",5);
  sVar3 = readlink(local_828,local_428,0x3ff);
  FVar4 = FUNC_RET_ERROR;
  if ((uint)sVar3 < 0x401) {
    license::mstrlcpy(buffer,local_428,(ulong)((uint)sVar3 + 1 & 0xfff));
    FVar4 = FUNC_RET_OK;
  }
  return FVar4;
}

Assistant:

FUNCTION_RETURN getModuleName(char buffer[MAX_PATH]) {
	FUNCTION_RETURN result;
	char path[MAX_PATH] = {0};
	char proc_path[MAX_PATH], pidStr[64];
	pid_t pid = getpid();
	sprintf(pidStr, "%d", pid);
	strcpy(proc_path, "/proc/");
	strcat(proc_path, pidStr);
	strcat(proc_path, "/exe");

	int ch = readlink(proc_path, path, MAX_PATH - 1);
	if (ch > MAX_PATH || ch < 0) {
		result = FUNC_RET_ERROR;
	} else {
		mstrlcpy(buffer, path, ch + 1);
		result = FUNC_RET_OK;
	}
	return result;
}